

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxCommon.cpp
# Opt level: O1

RuntimeID Jinx::Impl::GetRandomId(void)

{
  uint64_t uVar1;
  char local_28 [24];
  __atomic_base<unsigned_long> _Stack_10;
  
  builtin_strncpy(local_28,"0@@@@UniqueName",0x10);
  local_28[0x10] = '\0';
  local_28[0x11] = '\0';
  local_28[0x12] = '\0';
  local_28[0x13] = '\0';
  local_28[0x14] = '\0';
  local_28[0x15] = '\0';
  local_28[0x16] = '\0';
  local_28[0x17] = '\0';
  LOCK();
  UNLOCK();
  _Stack_10 = CommonData::uniqueId.super___atomic_base<unsigned_long>._M_i;
  CommonData::uniqueId.super___atomic_base<unsigned_long>._M_i =
       (__atomic_base<unsigned_long>)
       (__atomic_base<unsigned_long>)
       (CommonData::uniqueId.super___atomic_base<unsigned_long>._M_i + 1)._M_i;
  uVar1 = GetHash(local_28,0x20);
  return uVar1;
}

Assistant:

inline_t RuntimeID GetRandomId()
		{
			// Create hash source of current time, a unique id, and a string
			HashData hd;
			memset(&hd, 0, sizeof(hd));
			StrCopy(hd.hs, 16, "0@@@@UniqueName");
			hd.h1 = std::chrono::high_resolution_clock::time_point().time_since_epoch().count();
			hd.h2 = CommonData::uniqueId++;

			// Return a new random Id from unique hash source
			return GetHash(&hd, sizeof(hd));
		}